

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxNodeHeap.h
# Opt level: O2

void __thiscall maxNodeHeap::deleteNode(maxNodeHeap *this,NodeID node)

{
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_00;
  int iVar1;
  int pos;
  int iVar2;
  pointer ppVar3;
  pointer pQVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  mapped_type *pmVar7;
  pointer ppVar8;
  ulong uVar9;
  long lVar10;
  pointer pQVar11;
  NodeID node_local;
  int cnode;
  undefined4 uStack_3c;
  int local_38;
  
  this_00 = &this->m_element_index;
  node_local = node;
  pmVar7 = std::__detail::
           _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&node_local);
  iVar1 = *pmVar7;
  pos = (this->m_elements).
        super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar1].m_index;
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&this_00->_M_h,&node_local);
  ppVar8 = (this->m_heap).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar3 = (this->m_heap).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar2 = ppVar8[pos].first;
  ppVar8[pos].first = ppVar3[-1].first;
  ppVar3[-1].first = iVar2;
  iVar2 = ppVar8[pos].second;
  ppVar8[pos].second = ppVar3[-1].second;
  ppVar3[-1].second = iVar2;
  pQVar4 = (this->m_elements).
           super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pQVar4[ppVar8[pos].second].m_index = pos;
  pQVar11 = (this->m_elements).
            super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  lVar10 = (long)pQVar11 - (long)pQVar4;
  if (iVar1 != (int)(lVar10 / 0x18) + -1) {
    local_38 = pQVar4[iVar1].m_index;
    uVar5._0_4_ = pQVar4[iVar1].m_data;
    uVar5._4_4_ = pQVar4[iVar1].m_key;
    pQVar4[iVar1].m_index = *(int *)((long)pQVar4 + lVar10 + -8);
    uVar6 = *(undefined8 *)((long)pQVar4 + lVar10 + -0x10);
    pQVar4[iVar1].m_data = (Data)(int)uVar6;
    pQVar4[iVar1].m_key = (int)((ulong)uVar6 >> 0x20);
    *(int *)((long)pQVar4 + lVar10 + -8) = local_38;
    *(undefined8 *)((long)pQVar4 + lVar10 + -0x10) = uVar5;
    pQVar4 = (this->m_elements).
             super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (this->m_heap).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start[pQVar4[iVar1].m_index].second = iVar1;
    _cnode = CONCAT44(uVar5._4_4_,pQVar4[iVar1].m_data.node);
    pmVar7 = std::__detail::
             _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,&cnode);
    *pmVar7 = iVar1;
    pQVar11 = (this->m_elements).
              super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  (this->m_elements).
  super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = pQVar11 + -1;
  (**pQVar11[-1]._vptr_QElement)();
  ppVar8 = (this->m_heap).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
  (this->m_heap).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppVar8;
  uVar9 = (long)ppVar8 -
          (long)(this->m_heap).
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  if ((1 < uVar9) && (pos < (int)uVar9)) {
    siftDown(this,pos);
    siftUp(this,pos);
  }
  return;
}

Assistant:

inline void maxNodeHeap::deleteNode(NodeID node) {
        int element_index = m_element_index[node];
        int heap_index    = m_elements[element_index].get_index();

        m_element_index.erase(node);

        std::swap( m_heap[heap_index], m_heap[m_heap.size() - 1]);
        //update the position of its element in the element array
        m_elements[m_heap[heap_index].second].set_index(heap_index);

        // we dont want holes in the elements array -- delete the deleted element from the array
        if(element_index != (int)(m_elements.size() - 1)) {
                std::swap( m_elements[element_index], m_elements[m_elements.size() - 1]);
                m_heap[ m_elements[element_index].get_index() ].second = element_index;
                int cnode              = m_elements[element_index].get_data().node;
                m_element_index[cnode] = element_index;
        }

        m_elements.pop_back();
        m_heap.pop_back();

        if( m_heap.size() > 1 && heap_index < (int)m_heap.size() ) {
                //fix the max heap property
                siftDown(heap_index);
                siftUp(heap_index);
        }
}